

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSelect
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Select *curr,
          optional<wasm::Type> type)

{
  if (((undefined1  [16])
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    IRBuilder::ChildPopper::ConstraintCollector::noteAnyType
              ((ConstraintCollector *)this,&curr->ifTrue);
    IRBuilder::ChildPopper::ConstraintCollector::noteAnyType
              ((ConstraintCollector *)this,&curr->ifFalse);
  }
  else {
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->ifTrue,
               type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload._M_value);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->ifFalse,
               type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload._M_value);
  }
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->condition,(Type)0x2);
  return;
}

Assistant:

void visitSelect(Select* curr, std::optional<Type> type = std::nullopt) {
    if (type) {
      note(&curr->ifTrue, *type);
      note(&curr->ifFalse, *type);
    } else {
      noteAny(&curr->ifTrue);
      noteAny(&curr->ifFalse);
    }
    note(&curr->condition, Type::i32);
  }